

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O3

void __thiscall OpenMD::COHZ::correlateFrames(COHZ *this,int frame1,int frame2,int timeBin)

{
  double *pdVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  double dVar4;
  long lVar5;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar6;
  long lVar7;
  pointer piVar8;
  long lVar9;
  pointer piVar10;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> s1;
  vector<int,_std::allocator<int>_> local_b8;
  vector<int,_std::allocator<int>_> local_98;
  double local_78 [5];
  double local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78[2] = 0.0;
  local_78[3] = 0.0;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_98,
             (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
             super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
             super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.sele1ToIndex_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame1);
  pvVar6 = &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
            super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
            super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.sele1ToIndex_;
  if ((this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
      super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
      super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.uniqueSelections_ != false) {
    pvVar6 = &(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
              super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
              super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.sele2ToIndex_;
  }
  std::vector<int,_std::allocator<int>_>::operator=
            (&local_b8,
             (pvVar6->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + frame2);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar8 = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar10 = local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    while (piVar10 !=
           local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish) {
      if (piVar8 != local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        do {
          if (*piVar10 <= *piVar8) break;
          piVar8 = piVar8 + 1;
        } while (piVar8 != local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      do {
        if (*piVar8 <= *piVar10) break;
        piVar10 = piVar10 + 1;
      } while (piVar10 !=
               local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
      if ((piVar8 == local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish) ||
         (piVar10 ==
          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish)) break;
      (*(this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
        super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
        super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.super_DynamicProperty._vptr_DynamicProperty
        [0x13])(&local_50,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
                (ulong)((long)piVar8 -
                       (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2,
                (ulong)((long)piVar10 -
                       (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
      local_78[2] = (double)local_40;
      local_78[3] = (double)uStack_38;
      local_78[0] = local_50;
      local_78[1] = (double)uStack_48;
      lVar5 = (long)*(int *)((long)piVar8 +
                            (*(long *)&(this->zbin_).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[frame1].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data -
                            (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start));
      lVar7 = lVar5 * 0x20 +
              *(long *)&(this->histogram_).
                        super__Vector_base<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>,_std::allocator<std::vector<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[timeBin].
                        super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                        ._M_impl.super__Vector_impl_data;
      lVar9 = 0;
      do {
        pdVar1 = (double *)(lVar7 + lVar9 * 8);
        dVar4 = pdVar1[1] + local_78[lVar9 + 1];
        auVar3._8_4_ = SUB84(dVar4,0);
        auVar3._0_8_ = *pdVar1 + local_78[lVar9];
        auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
        *(undefined1 (*) [16])(lVar7 + lVar9 * 8) = auVar3;
        lVar9 = lVar9 + 2;
      } while (lVar9 != 4);
      piVar2 = (int *)(*(long *)&(this->counts_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[timeBin].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + lVar5 * 4);
      *piVar2 = *piVar2 + 1;
      piVar8 = piVar8 + 1;
      piVar10 = piVar10 + 1;
      if (piVar8 == local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
    }
  }
  if (local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void COHZ::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    Vector<RealType, 4> corrVal(0.0);

    s1 = sele1ToIndex_[frame1];

    if (uniqueSelections_)
      s2 = sele2ToIndex_[frame2];
    else
      s2 = sele1ToIndex_[frame2];

    for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
         ++i1, ++i2) {
      // If the selections are dynamic, they might not have the
      // same objects in both frames, so we need to roll either of
      // the selections until we have the same object to
      // correlate.

      while (i1 != s1.end() && *i1 < *i2) {
        ++i1;
      }

      while (i2 != s2.end() && *i2 < *i1) {
        ++i2;
      }

      if (i1 == s1.end() || i2 == s2.end()) break;

      corrVal  = calcCorrVal(frame1, frame2, i1 - s1.begin(), i2 - s2.begin());
      int zBin = zbin_[frame1][i1 - s1.begin()];

      histogram_[timeBin][zBin] += corrVal;
      counts_[timeBin][zBin]++;
    }
  }